

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize_x86_avx512.cpp
# Opt level: O3

void ncnn::dequantize(int *intptr,float *ptr,Mat *scale_data,Mat *bias_data,int elemcount,
                     int elempack)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int scale_data_size;
  uint uVar7;
  int iVar8;
  uint uVar9;
  undefined4 in_register_00000084;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 in_ZMM6 [64];
  undefined1 in_ZMM7 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  undefined1 auVar11 [28];
  undefined1 auVar16 [32];
  
  uVar1 = *(undefined4 *)&scale_data->data;
  auVar10._4_4_ = uVar1;
  auVar10._0_4_ = uVar1;
  auVar10._8_4_ = uVar1;
  auVar10._12_4_ = uVar1;
  auVar11._16_4_ = uVar1;
  auVar11._0_16_ = auVar10;
  auVar11._20_4_ = uVar1;
  auVar11._24_4_ = uVar1;
  auVar12 = auVar10;
  if (1 < (int)bias_data) {
    if (in_stack_00000010 == 4) {
      auVar12._0_8_ = scale_data->data;
      auVar12._8_8_ = scale_data->refcount;
      auVar18._16_16_ = auVar12;
      auVar18._0_16_ = auVar12;
      auVar11 = auVar18._0_28_;
    }
    else if (in_stack_00000010 == 8) {
      auVar3._0_8_ = scale_data->data;
      auVar3._8_8_ = scale_data->refcount;
      auVar3._16_8_ = scale_data->elemsize;
      auVar3._24_4_ = scale_data->elempack;
      auVar3._28_4_ = *(undefined4 *)&scale_data->field_0x1c;
      auVar11 = auVar3._0_28_;
    }
  }
  uVar4 = in_stack_00000008 * in_stack_00000010;
  if (elempack == 0) {
    uVar7 = 0;
    if (7 < (int)uVar4) {
      uVar7 = uVar4 & 0x7ffffff8;
      iVar8 = 7;
      do {
        auVar18 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
        *ptr = auVar11._0_4_ * auVar18._0_4_;
        ptr[1] = auVar11._4_4_ * auVar18._4_4_;
        ptr[2] = auVar11._8_4_ * auVar18._8_4_;
        ptr[3] = auVar11._12_4_ * auVar18._12_4_;
        ptr[4] = auVar11._16_4_ * auVar18._16_4_;
        ptr[5] = auVar11._20_4_ * auVar18._20_4_;
        ptr[6] = auVar11._24_4_ * auVar18._24_4_;
        ptr[7] = auVar18._28_4_;
        intptr = (int *)((long)intptr + 0x20);
        ptr = ptr + 8;
        iVar8 = iVar8 + 8;
      } while (iVar8 < (int)uVar4);
    }
    uVar9 = uVar7 | 3;
    auVar18 = _DAT_005a4880;
    auVar3 = _DAT_005a48a0;
    while (_DAT_005a4880 = auVar18, _DAT_005a48a0 = auVar3, (int)uVar9 < (int)uVar4) {
      auVar13 = vcvtdq2ps_avx(*(undefined1 (*) [16])*(undefined1 (*) [32])intptr);
      *ptr = auVar12._0_4_ * auVar13._0_4_;
      ptr[1] = auVar12._4_4_ * auVar13._4_4_;
      ptr[2] = auVar12._8_4_ * auVar13._8_4_;
      ptr[3] = auVar12._12_4_ * auVar13._12_4_;
      intptr = (int *)(*(undefined1 (*) [32])intptr + 0x10);
      ptr = ptr + 4;
      uVar9 = uVar7 + 7;
      uVar7 = uVar7 + 4;
      auVar18 = _DAT_005a4880;
      auVar3 = _DAT_005a48a0;
    }
    if ((int)uVar7 < (int)uVar4) {
      uVar5 = CONCAT44(0,uVar4 + ~uVar7);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar5;
      auVar13 = vpshufd_avx(auVar13,0x44);
      auVar14 = vshufps_avx(auVar10,auVar10,0);
      uVar6 = 0;
      auVar17._8_8_ = 0x8000000000000000;
      auVar17._0_8_ = 0x8000000000000000;
      auVar12 = vorps_avx(auVar13,auVar17);
      auVar10 = vorps_avx(auVar13,auVar17);
      auVar15 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
      auVar13 = vorps_avx(auVar13,auVar17);
      do {
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar6;
        auVar17 = vpshufd_avx(auVar20,0x44);
        auVar22._16_16_ = auVar17;
        auVar22._0_16_ = auVar17;
        auVar16 = vorps_avx(auVar22,auVar18);
        auVar2 = vorps_avx(auVar22,auVar3);
        auVar29._0_8_ = auVar2._16_8_ ^ 0x8000000000000000;
        auVar29._8_4_ = auVar2._24_4_;
        auVar29._12_4_ = auVar2._28_4_ ^ 0x80000000;
        auVar17 = vpcmpgtq_avx(auVar29,auVar12);
        auVar21._0_8_ = auVar2._0_8_ ^ 0x8000000000000000;
        auVar21._8_4_ = auVar2._8_4_;
        auVar21._12_4_ = auVar2._12_4_ ^ 0x80000000;
        auVar20 = vpcmpgtq_avx(auVar21,auVar10);
        auVar17 = vpackssdw_avx(auVar20,auVar17);
        auVar30._0_8_ = auVar16._16_8_ ^ 0x8000000000000000;
        auVar30._8_4_ = auVar16._24_4_;
        auVar30._12_4_ = auVar16._28_4_ ^ 0x80000000;
        auVar20 = vpcmpgtq_avx(auVar30,auVar12);
        auVar24._0_8_ = auVar16._0_8_ ^ 0x8000000000000000;
        auVar24._8_4_ = auVar16._8_4_;
        auVar24._12_4_ = auVar16._12_4_ ^ 0x80000000;
        auVar21 = vpcmpgtq_avx(auVar24,auVar13);
        auVar20 = vpackssdw_avx(auVar21,auVar20);
        auVar17 = vpackssdw_avx(auVar20 ^ auVar15,auVar17 ^ auVar15);
        auVar20 = vpmovsxwd_avx(auVar17);
        auVar17 = vpunpckhwd_avx(auVar17,auVar17);
        auVar23._16_16_ = auVar17;
        auVar23._0_16_ = auVar20;
        auVar16 = vmaskmovps_avx(auVar23,*(undefined1 (*) [32])
                                          (*(undefined1 (*) [32])intptr + uVar6 * 4));
        auVar16 = vcvtdq2ps_avx(auVar16);
        auVar2._4_4_ = auVar16._4_4_ * auVar14._4_4_;
        auVar2._0_4_ = auVar16._0_4_ * auVar14._0_4_;
        auVar2._8_4_ = auVar16._8_4_ * auVar14._8_4_;
        auVar2._12_4_ = auVar16._12_4_ * auVar14._12_4_;
        auVar2._16_4_ = auVar16._16_4_ * auVar14._0_4_;
        auVar2._20_4_ = auVar16._20_4_ * auVar14._4_4_;
        auVar2._24_4_ = auVar16._24_4_ * auVar14._8_4_;
        auVar2._28_4_ = auVar16._28_4_;
        auVar16 = vmaskmovps_avx(auVar23,auVar2);
        *(undefined1 (*) [32])(ptr + uVar6) = auVar16;
        uVar6 = uVar6 + 8;
      } while ((uVar5 + 8 & 0xfffffffffffffff8) != uVar6);
    }
  }
  else {
    uVar1 = *(undefined4 *)CONCAT44(in_register_00000084,elemcount);
    auVar15._4_4_ = uVar1;
    auVar15._0_4_ = uVar1;
    auVar15._8_4_ = uVar1;
    auVar15._12_4_ = uVar1;
    auVar16._16_4_ = uVar1;
    auVar16._0_16_ = auVar15;
    auVar16._20_4_ = uVar1;
    auVar16._24_4_ = uVar1;
    auVar16._28_4_ = uVar1;
    auVar13 = auVar15;
    if (1 < elempack) {
      if (in_stack_00000010 == 4) {
        auVar13 = *(undefined1 (*) [16])CONCAT44(in_register_00000084,elemcount);
        auVar16._16_16_ = auVar13;
        auVar16._0_16_ = auVar13;
      }
      else if (in_stack_00000010 == 8) {
        auVar16 = *(undefined1 (*) [32])CONCAT44(in_register_00000084,elemcount);
      }
    }
    uVar7 = 0;
    if (7 < (int)uVar4) {
      uVar7 = uVar4 & 0x7ffffff8;
      iVar8 = 7;
      do {
        auVar18 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
        *ptr = auVar11._0_4_ * auVar18._0_4_ + auVar16._0_4_;
        ptr[1] = auVar11._4_4_ * auVar18._4_4_ + auVar16._4_4_;
        ptr[2] = auVar11._8_4_ * auVar18._8_4_ + auVar16._8_4_;
        ptr[3] = auVar11._12_4_ * auVar18._12_4_ + auVar16._12_4_;
        ptr[4] = auVar11._16_4_ * auVar18._16_4_ + auVar16._16_4_;
        ptr[5] = auVar11._20_4_ * auVar18._20_4_ + auVar16._20_4_;
        ptr[6] = auVar11._24_4_ * auVar18._24_4_ + auVar16._24_4_;
        ptr[7] = auVar18._28_4_ + auVar16._28_4_;
        intptr = (int *)((long)intptr + 0x20);
        ptr = ptr + 8;
        iVar8 = iVar8 + 8;
      } while (iVar8 < (int)uVar4);
    }
    uVar9 = uVar7 | 3;
    auVar18 = _DAT_005a4880;
    auVar3 = _DAT_005a48a0;
    while (_DAT_005a4880 = auVar18, _DAT_005a48a0 = auVar3, (int)uVar9 < (int)uVar4) {
      auVar14 = vcvtdq2ps_avx(*(undefined1 (*) [16])*(undefined1 (*) [32])intptr);
      *ptr = auVar12._0_4_ * auVar14._0_4_ + auVar13._0_4_;
      ptr[1] = auVar12._4_4_ * auVar14._4_4_ + auVar13._4_4_;
      ptr[2] = auVar12._8_4_ * auVar14._8_4_ + auVar13._8_4_;
      ptr[3] = auVar12._12_4_ * auVar14._12_4_ + auVar13._12_4_;
      intptr = (int *)(*(undefined1 (*) [32])intptr + 0x10);
      ptr = ptr + 4;
      uVar9 = uVar7 + 7;
      uVar7 = uVar7 + 4;
      auVar18 = _DAT_005a4880;
      auVar3 = _DAT_005a48a0;
    }
    if ((int)uVar7 < (int)uVar4) {
      uVar5 = CONCAT44(0,uVar4 + ~uVar7);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar5;
      auVar13 = vpshufd_avx(auVar14,0x44);
      auVar14 = vshufps_avx(auVar10,auVar10,0);
      auVar17 = vshufps_avx(auVar15,auVar15,0);
      uVar6 = 0;
      auVar19._8_8_ = 0x8000000000000000;
      auVar19._0_8_ = 0x8000000000000000;
      auVar12 = vorps_avx(auVar13,auVar19);
      auVar10 = vorps_avx(auVar13,auVar19);
      auVar15 = vpcmpeqd_avx(in_ZMM7._0_16_,in_ZMM7._0_16_);
      auVar13 = vorps_avx(auVar13,auVar19);
      do {
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar6;
        auVar20 = vpshufd_avx(auVar25,0x44);
        auVar27._16_16_ = auVar20;
        auVar27._0_16_ = auVar20;
        auVar16 = vorps_avx(auVar27,auVar18);
        auVar2 = vorps_avx(auVar27,auVar3);
        auVar33._0_8_ = auVar2._16_8_ ^ 0x8000000000000000;
        auVar33._8_4_ = auVar2._24_4_;
        auVar33._12_4_ = auVar2._28_4_ ^ 0x80000000;
        auVar20 = vpcmpgtq_avx(auVar33,auVar12);
        auVar26._0_8_ = auVar2._0_8_ ^ 0x8000000000000000;
        auVar26._8_4_ = auVar2._8_4_;
        auVar26._12_4_ = auVar2._12_4_ ^ 0x80000000;
        auVar21 = vpcmpgtq_avx(auVar26,auVar10);
        auVar20 = vpackssdw_avx(auVar21,auVar20);
        auVar34._0_8_ = auVar16._16_8_ ^ 0x8000000000000000;
        auVar34._8_4_ = auVar16._24_4_;
        auVar34._12_4_ = auVar16._28_4_ ^ 0x80000000;
        auVar21 = vpcmpgtq_avx(auVar34,auVar12);
        auVar31._0_8_ = auVar16._0_8_ ^ 0x8000000000000000;
        auVar31._8_4_ = auVar16._8_4_;
        auVar31._12_4_ = auVar16._12_4_ ^ 0x80000000;
        auVar24 = vpcmpgtq_avx(auVar31,auVar13);
        auVar21 = vpackssdw_avx(auVar24,auVar21);
        auVar20 = vpackssdw_avx(auVar21 ^ auVar15,auVar20 ^ auVar15);
        auVar21 = vpmovsxwd_avx(auVar20);
        auVar20 = vpunpckhwd_avx(auVar20,auVar20);
        auVar28._16_16_ = auVar20;
        auVar28._0_16_ = auVar21;
        auVar16 = vmaskmovps_avx(auVar28,*(undefined1 (*) [32])
                                          (*(undefined1 (*) [32])intptr + uVar6 * 4));
        auVar16 = vcvtdq2ps_avx(auVar16);
        auVar32._0_4_ = auVar16._0_4_ * auVar14._0_4_ + auVar17._0_4_;
        auVar32._4_4_ = auVar16._4_4_ * auVar14._4_4_ + auVar17._4_4_;
        auVar32._8_4_ = auVar16._8_4_ * auVar14._8_4_ + auVar17._8_4_;
        auVar32._12_4_ = auVar16._12_4_ * auVar14._12_4_ + auVar17._12_4_;
        auVar32._16_4_ = auVar16._16_4_ * auVar14._0_4_ + auVar17._0_4_;
        auVar32._20_4_ = auVar16._20_4_ * auVar14._4_4_ + auVar17._4_4_;
        auVar32._24_4_ = auVar16._24_4_ * auVar14._8_4_ + auVar17._8_4_;
        auVar32._28_4_ = auVar16._28_4_ + auVar17._12_4_;
        auVar16 = vmaskmovps_avx(auVar28,auVar32);
        *(undefined1 (*) [32])(ptr + uVar6) = auVar16;
        uVar6 = uVar6 + 8;
      } while ((uVar5 + 8 & 0xfffffffffffffff8) != uVar6);
    }
  }
  return;
}

Assistant:

static void dequantize(const int* intptr, float* ptr, const Mat& scale_data, const Mat& bias_data, int elemcount, int elempack)
{
    const int scale_data_size = scale_data.w;
    const int bias_data_size = bias_data.w;
    const int size = elemcount * elempack;

    // NCNN_LOGE("dequantize %d %d   %d %d", scale_data_size, bias_data_size, elemcount, elempack);

    float scale = scale_data[0];
#if __SSE2__
    __m128 _scale = _mm_set1_ps(scale);
#if __AVX__
    __m256 _scale_avx = _mm256_set1_ps(scale);
#if __AVX512F__
    __m512 _scale_avx512 = _mm512_set1_ps(scale);
#endif // __AVX512F__
#endif // __AVX__
    if (scale_data_size > 1)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_avx512 = _mm512_loadu_ps((const float*)scale_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            _scale_avx = _mm256_loadu_ps((const float*)scale_data);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
        }
#endif // __AVX__
        if (elempack == 4)
        {
            _scale = _mm_loadu_ps((const float*)scale_data);
#if __AVX__
            _scale_avx = combine4x2_ps(_scale, _scale);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
#endif // __AVX__
        }
    }
#endif // __SSE2__

    if (bias_data_size == 0)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_mul_ps(_v, _scale_avx512);
            _mm512_storeu_ps(ptr, _v);
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_mul_ps(_v, _scale_avx);
            _mm256_storeu_ps(ptr, _v);
            intptr += 8;
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_mul_ps(_v, _scale);
            _mm_storeu_ps(ptr, _v);
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *intptr * scale;
            intptr++;
            ptr++;
        }
    }
    else
    {
        float bias = bias_data[0];
#if __SSE2__
        __m128 _bias = _mm_set1_ps(bias);
#if __AVX__
        __m256 _bias_avx = _mm256_set1_ps(bias);
#if __AVX512F__
        __m512 _bias_avx512 = _mm512_set1_ps(bias);
#endif // __AVX512F__
#endif // __AVX__
        if (bias_data_size > 1)
        {
#if __AVX__
#if __AVX512F__
            if (elempack == 16)
            {
                _bias_avx512 = _mm512_loadu_ps((const float*)bias_data);
            }
#endif // __AVX512F__
            if (elempack == 8)
            {
                _bias_avx = _mm256_loadu_ps((const float*)bias_data);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
            }
#endif // __AVX__
            if (elempack == 4)
            {
                _bias = _mm_loadu_ps((const float*)bias_data);
#if __AVX__
                _bias_avx = combine4x2_ps(_bias, _bias);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
#endif // __AVX__
            }
        }
#endif // __SSE2__

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_fmadd_ps(_v, _scale_avx512, _bias_avx512);
            _mm512_storeu_ps(ptr, _v);
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_comp_fmadd_ps(_v, _scale_avx, _bias_avx);
            _mm256_storeu_ps(ptr, _v);
            intptr += 8;
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_comp_fmadd_ps(_v, _scale, _bias);
            _mm_storeu_ps(ptr, _v);
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *intptr * scale + bias;
            intptr++;
            ptr++;
        }
    }
}